

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::BufferStorage::ErrorsTest::verifyError
          (ErrorsTest *this,GLenum expected_error,GLchar *error_message,bool *out_test_result)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  char *local_1d8;
  char *local_1d0 [3];
  MessageBuilder local_1b8;
  GLenum local_34;
  long lStack_30;
  GLenum error;
  Functions *gl;
  bool *out_test_result_local;
  GLchar *error_message_local;
  ErrorsTest *pEStack_10;
  GLenum expected_error_local;
  ErrorsTest *this_local;
  
  gl = (Functions *)out_test_result;
  out_test_result_local = (bool *)error_message;
  error_message_local._4_4_ = expected_error;
  pEStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = (**(code **)(lStack_30 + 0x800))();
  if (local_34 != error_message_local._4_4_) {
    *(undefined1 *)&gl->activeShaderProgram = 0;
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [20])"Got invalid error: ");
    local_1d0[0] = glu::getErrorName(local_34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])0x2a14159);
    local_1d8 = glu::getErrorName(error_message_local._4_4_);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])". Message: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&out_test_result_local);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return;
}

Assistant:

void ErrorsTest::verifyError(glw::GLenum expected_error, const glw::GLchar* error_message, bool& out_test_result)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLenum error = gl.getError();

	if (error != expected_error)
	{
		out_test_result = false;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Got invalid error: " << glu::getErrorName(error)
			<< ", expected: " << glu::getErrorName(expected_error) << ". Message: " << error_message
			<< tcu::TestLog::EndMessage;
	}
}